

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O2

void __thiscall Automaton::buildNullables(Automaton *this)

{
  Grammar *pGVar1;
  _List_iterator<std::_List_iterator<QString>_> _Var2;
  byte bVar3;
  _List_node_base *p_Var4;
  pair<std::_Rb_tree_iterator<std::_List_iterator<QString>_>,_bool> pVar5;
  
  bVar3 = 1;
  while ((bVar3 & 1) != 0) {
    pGVar1 = this->_M_grammar;
    p_Var4 = (_List_node_base *)&pGVar1->rules;
    bVar3 = 0;
    while (p_Var4 = (((_List_base<Rule,_std::allocator<Rule>_> *)&p_Var4->_M_next)->_M_impl)._M_node
                    .super__List_node_base._M_next, p_Var4 != (_List_node_base *)&pGVar1->rules) {
      _Var2 = std::
              __find_if<std::_List_iterator<std::_List_iterator<QString>>,__gnu_cxx::__ops::_Iter_pred<NotNullable>>
                        (*(_List_node_base **)((long)(p_Var4 + 1) + 8),
                         (_List_node_base *)((long)(p_Var4 + 1) + 8U),this);
      if (_Var2._M_node == (_List_node_base *)((long)(p_Var4 + 1) + 8U)) {
        pVar5 = std::
                _Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
                ::_M_insert_unique<std::_List_iterator<QString>const&>
                          ((_Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
                            *)&this->nullables,(_List_iterator<QString> *)(p_Var4 + 1));
        bVar3 = bVar3 | pVar5.second;
      }
      pGVar1 = this->_M_grammar;
    }
  }
  return;
}

Assistant:

void Automaton::buildNullables ()
{
  bool changed = true;

  while (changed)
    {
      changed = false;

      for (RulePointer rule = _M_grammar->rules.begin (); rule != _M_grammar->rules.end (); ++rule)
        {
          NameList::iterator nn = std::find_if(rule->rhs.begin(), rule->rhs.end(), NotNullable(this));

          if (nn == rule->rhs.end ())
            changed |= nullables.insert (rule->lhs).second;
        }
    }

#ifndef QLALR_NO_DEBUG_NULLABLES
  qerr() << "nullables = {" << nullables << Qt::endl;
#endif
}